

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O1

FVoxel * R_LoadKVX(int lumpnum)

{
  undefined8 *puVar1;
  FVoxelMipLevel *pFVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  uint uVar6;
  FVoxel *this;
  long lVar7;
  int *piVar8;
  BYTE **ppBVar9;
  BYTE *pBVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  DWORD *pDVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  LumpRecord *pLVar23;
  LumpRecord *pLVar24;
  uint uVar25;
  FMemLump lump;
  kvxslab_t *slabs [5];
  FWadCollection local_88;
  
  this = (FVoxel *)operator_new(0x158);
  lVar7 = 0x28;
  do {
    *(undefined8 *)((long)this->Mips + lVar7 + -0x28) = 0;
    *(undefined4 *)((long)this->Mips + lVar7 + -0x20) = 0;
    puVar1 = (undefined8 *)((long)this->Mips + lVar7 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->Mips + lVar7 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->Mips[0].SizeZ + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0x168);
  this->Palette = (BYTE *)0x0;
  FWadCollection::ReadLump(&local_88,0x1c74350);
  pLVar23 = (LumpRecord *)((long)local_88.Files.Array + -0x10);
  local_88.Files._8_8_ = ZEXT48(*(uint *)&pLVar23->field_0x4);
  if (local_88.Files._8_8_ == 0) {
    local_88.Files.Array = (FResourceFile **)0x0;
  }
  iVar17 = *(uint *)&pLVar23->field_0x4 - 0x305;
  uVar22 = 0;
  pLVar23 = (LumpRecord *)local_88.Files.Array;
  local_88.LumpInfo.Array = (LumpRecord *)local_88.Files.Array;
  do {
    uVar13 = pLVar23->wadnum;
    pLVar24 = pLVar23;
    iVar19 = 2;
    if (0x17 < (int)uVar13 && (int)uVar13 <= iVar17) {
      pLVar24 = (LumpRecord *)&pLVar23->field_0x4;
      pFVar2 = this->Mips + uVar22;
      bVar5 = pLVar23->field_0x4;
      local_88.NextLumpIndex = (DWORD *)((ulong)(byte)pLVar23->field_0x5 << 8);
      uVar11 = (uint)(byte)pLVar23->field_0x6 * 0x10000;
      uVar12 = (uint)(byte)pLVar23->field_0x7 * 0x1000000;
      uVar25 = (int)local_88.NextLumpIndex + (uint)bVar5 | uVar11 | uVar12;
      this->Mips[uVar22].SizeX = uVar25;
      iVar19 = *(int *)&pLVar23->lump;
      this->Mips[uVar22].SizeY = iVar19;
      this->Mips[uVar22].SizeZ = *(int *)((long)&pLVar23->lump + 4);
      this->Mips[uVar22].Pivot.X = (double)pLVar23[1].wadnum * 0.00390625;
      this->Mips[uVar22].Pivot.Y = (double)*(int *)&pLVar23[1].field_0x4 * 0.00390625;
      this->Mips[uVar22].Pivot.Z = (double)*(int *)&pLVar23[1].lump * 0.00390625;
      iVar21 = (iVar19 + 1) * uVar25;
      iVar14 = iVar21 * 2 + uVar25 * 4 + 4;
      uVar6 = (uVar13 - 0x18) - iVar14;
      iVar19 = 2;
      if (-1 < (int)uVar6) {
        uVar20 = (ulong)uVar13;
        if (uVar13 - 0x18 != iVar14) {
          local_88.LumpInfo._8_8_ = (ulong)uVar13;
          local_88.FirstLumpIndex = (DWORD *)(ulong)bVar5;
          piVar8 = (int *)operator_new__((ulong)(uVar13 - 0x15 & 0xfffffffc));
          pFVar2->OffsetX = piVar8;
          pFVar2->OffsetXY = (short *)(piVar8 + (long)(int)uVar25 + 1);
          pFVar2->SlabData = (BYTE *)((long)piVar8 + (long)iVar21 * 2 + (long)(int)uVar25 * 4 + 4);
          if ((int)uVar12 < 0) {
            uVar20 = 0;
          }
          else {
            uVar20 = 0xffffffffffffffff;
            uVar13 = 0;
            do {
              piVar8[uVar20 + 1] = (&pLVar23[2].wadnum)[uVar20] - iVar14;
              uVar20 = uVar20 + 1;
              uVar13 = uVar13 + 4;
            } while (uVar20 < uVar25);
            uVar20 = (ulong)uVar13;
          }
          iVar19 = 2;
          if ((*piVar8 != 0) || (piVar8[pFVar2->SizeX] != uVar6)) goto LAB_005183ce;
          uVar25 = (pFVar2->SizeY + 1) * uVar25;
          if (0 < (int)uVar25) {
            uVar15 = 0;
            do {
              *(undefined2 *)
               ((long)piVar8 +
               uVar15 * 2 +
               (long)(int)(uVar12 + uVar11 + (int)local_88.NextLumpIndex +
                          (int)local_88.FirstLumpIndex) * 4 + 4) =
                   *(undefined2 *)((long)&pLVar23[1].lump + uVar15 * 2 + uVar20 + 4);
              uVar15 = uVar15 + 1;
            } while (uVar25 != uVar15);
          }
          if (0 < (long)pFVar2->SizeX) {
            uVar13 = pFVar2->SizeY;
            lVar7 = 0;
            lVar18 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar20 = 0;
                do {
                  if (uVar6 < (uint)((int)*(short *)((long)pFVar2->OffsetXY + uVar20 * 2 + lVar7) +
                                    pFVar2->OffsetX[lVar18])) {
                    FVoxel::~FVoxel(this);
                    operator_delete(this,0x158);
                    iVar19 = 1;
                    goto LAB_005183ce;
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar13 != uVar20);
              }
              lVar18 = lVar18 + 1;
              lVar7 = lVar7 + (ulong)(uVar13 + 1) * 2;
            } while (lVar18 != pFVar2->SizeX);
          }
          (&local_88.FirstLumpIndex_FullName)[uVar22] =
               (DWORD *)((long)&pLVar23[1].lump + (long)iVar14 + 4);
          uVar20 = local_88.LumpInfo._8_8_;
        }
        pLVar24 = (LumpRecord *)((long)pLVar24 + (uVar20 & 0xffffffff));
        iVar17 = (iVar17 - (int)uVar20) + -4;
        iVar19 = 0;
      }
    }
LAB_005183ce:
    if (iVar19 != 0) {
      if (iVar19 != 2) goto LAB_0051845b;
      goto LAB_00518423;
    }
    uVar22 = uVar22 + 1;
    pLVar23 = pLVar24;
  } while (uVar22 != 5);
  uVar22 = 5;
LAB_00518423:
  if (((int)uVar22 == 0) ||
     (pLVar23 = (LumpRecord *)
                ((long)&local_88.LumpInfo.Array[-0x30].wadnum + (long)(local_88.Files.Most + -1)),
     pLVar24 != pLVar23)) {
LAB_00518446:
    FVoxel::~FVoxel(this);
    operator_delete(this,0x158);
LAB_0051845b:
    this = (FVoxel *)0x0;
  }
  else {
    uVar22 = uVar22 & 0xffffffff;
    ppBVar9 = &this->Mips[uVar22 - 1].SlabData;
    do {
      if ((long)uVar22 < 1) {
        uVar13 = 0;
        goto LAB_005184aa;
      }
      uVar22 = uVar22 - 1;
      pBVar10 = *ppBVar9;
      ppBVar9 = ppBVar9 + -8;
    } while (pBVar10 == (BYTE *)0x0);
    uVar13 = (int)uVar22 + 1;
LAB_005184aa:
    this->NumMips = uVar13;
    if (1 < (int)uVar13) {
      lVar7 = 0x40;
      do {
        dVar3 = *(double *)((long)this->Mips + lVar7 + -0x30);
        dVar4 = *(double *)((long)this->Mips + lVar7 + -0x28);
        *(double *)((long)&this->Mips[0].Pivot.Z + lVar7) =
             *(double *)((long)this->Mips + lVar7 + -0x20) * 0.5;
        *(double *)((long)&this->Mips[0].Pivot.Y + lVar7) = dVar4 * 0.5;
        *(double *)((long)&this->Mips[0].Pivot.X + lVar7) = dVar3 * 0.5;
        lVar7 = lVar7 + 0x40;
      } while ((ulong)uVar13 << 6 != lVar7);
    }
    if (0 < (int)uVar13) {
      uVar22 = 0;
      do {
        pBVar10 = this->Mips[uVar22].SlabData;
        pDVar16 = (&local_88.FirstLumpIndex_FullName)[uVar22];
        iVar17 = this->Mips[uVar22].OffsetX[this->Mips[uVar22].SizeX];
        do {
          iVar19 = iVar17;
          if (iVar19 < 3) goto LAB_0051858d;
          bVar5 = *(byte *)((long)pDVar16 + 1);
          lVar7 = (ulong)bVar5 + 3;
          iVar14 = (int)lVar7;
          iVar17 = iVar19;
          if (iVar14 <= iVar19) {
            *pBVar10 = (BYTE)*pDVar16;
            pBVar10[1] = bVar5;
            pBVar10[2] = *(BYTE *)((long)pDVar16 + 2);
            if (bVar5 != 0) {
              uVar20 = 0;
              do {
                pBVar10[uVar20 + 3] = *(BYTE *)((long)pDVar16 + uVar20 + 3);
                uVar20 = uVar20 + 1;
              } while (bVar5 != uVar20);
            }
            pDVar16 = (DWORD *)((long)pDVar16 + lVar7);
            pBVar10 = pBVar10 + lVar7;
            iVar17 = iVar19 - iVar14;
          }
        } while (iVar14 <= iVar19);
        if (2 < iVar19) goto LAB_00518446;
LAB_0051858d:
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar13);
    }
    this->LumpNum = lumpnum;
    pBVar10 = (BYTE *)operator_new__(0x300);
    this->Palette = pBVar10;
    memcpy(pBVar10,pLVar23,0x300);
  }
  FMemLump::~FMemLump((FMemLump *)&local_88);
  return this;
}

Assistant:

FVoxel *R_LoadKVX(int lumpnum)
{
	const kvxslab_t *slabs[MAXVOXMIPS];
	FVoxel *voxel = new FVoxel;
	const BYTE *rawmip;
	int mip, maxmipsize;
	int i, j, n;

	FMemLump lump = Wads.ReadLump(lumpnum);	// FMemLump adds an extra 0 byte to the end.
	BYTE *rawvoxel = (BYTE *)lump.GetMem();
	int voxelsize = (int)(lump.GetSize()-1);

	// Oh, KVX, why couldn't you have a proper header? We'll just go through
	// and collect each MIP level, doing lots of range checking, and if the
	// last one doesn't end exactly 768 bytes before the end of the file,
	// we'll reject it.

	for (mip = 0, rawmip = rawvoxel, maxmipsize = voxelsize - 768 - 4;
		 mip < MAXVOXMIPS;
		 mip++)
	{
		int numbytes = GetInt(rawmip);
		if (numbytes > maxmipsize || numbytes < 24)
		{
			break;
		}
		rawmip += 4;

		FVoxelMipLevel *mipl = &voxel->Mips[mip];

		// Load header data.
		mipl->SizeX = GetInt(rawmip + 0);
		mipl->SizeY = GetInt(rawmip + 4);
		mipl->SizeZ = GetInt(rawmip + 8);
		mipl->Pivot.X = GetInt(rawmip + 12) / 256.;
		mipl->Pivot.Y = GetInt(rawmip + 16) / 256.;
		mipl->Pivot.Z = GetInt(rawmip + 20) / 256.;

		// How much space do we have for voxdata?
		int offsetsize = (mipl->SizeX + 1) * 4 + mipl->SizeX * (mipl->SizeY + 1) * 2;
		int voxdatasize = numbytes - 24 - offsetsize;
		if (voxdatasize < 0)
		{ // Clearly, not enough.
			break;
		}
		if (voxdatasize != 0)
		{	// This mip level is not empty.
			// Allocate slab data space.
			mipl->OffsetX = new int[(numbytes - 24 + 3) / 4];
			mipl->OffsetXY = (short *)(mipl->OffsetX + mipl->SizeX + 1);
			mipl->SlabData = (BYTE *)(mipl->OffsetXY + mipl->SizeX * (mipl->SizeY + 1));

			// Load x offsets.
			for (i = 0, n = mipl->SizeX; i <= n; ++i)
			{
				// The X offsets stored in the KVX file are relative to the start of the
				// X offsets array. Make them relative to voxdata instead.
				mipl->OffsetX[i] = GetInt(rawmip + 24 + i * 4) - offsetsize;
			}

			// The first X offset must be 0 (since we subtracted offsetsize), according to the spec:
			//		NOTE: xoffset[0] = (xsiz+1)*4 + xsiz*(ysiz+1)*2 (ALWAYS)
			if (mipl->OffsetX[0] != 0)
			{
				break;
			}
			// And the final X offset must point just past the end of the voxdata.
			if (mipl->OffsetX[mipl->SizeX] != voxdatasize)
			{
				break;
			}

			// Load xy offsets.
			i = 24 + i * 4;
			for (j = 0, n *= mipl->SizeY + 1; j < n; ++j)
			{
				mipl->OffsetXY[j] = GetShort(rawmip + i + j * 2);
			}

			// Ensure all offsets are within bounds.
			for (i = 0; i < mipl->SizeX; ++i)
			{
				int xoff = mipl->OffsetX[i];
				for (j = 0; j < mipl->SizeY; ++j)
				{
					int yoff = mipl->OffsetXY[(mipl->SizeY + 1) * i + j];
					if (unsigned(xoff + yoff) > unsigned(voxdatasize))
					{
						delete voxel;
						return NULL;
					}
				}
			}

			// Record slab location for the end.
			slabs[mip] = (kvxslab_t *)(rawmip + 24 + offsetsize);
		}

		// Time for the next mip Level.
		rawmip += numbytes;
		maxmipsize -= numbytes + 4;
	}